

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLLinOp.cpp
# Opt level: O0

void __thiscall
amrex::MLLinOp::make
          (MLLinOp *this,
          Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
          *mf,IntVect *ng)

{
  int *piVar1;
  undefined8 in_RDX;
  long *in_RDI;
  int mlev;
  int alev;
  Any *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  size_type in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar2;
  
  std::
  vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
  ::clear((vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
           *)0x150bb17);
  std::
  vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
  ::resize((vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
            *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
           in_stack_ffffffffffffffd8);
  for (iVar2 = 0; iVar2 < *(int *)((long)in_RDI + 0x34); iVar2 = iVar2 + 1) {
    Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 (size_type)in_stack_ffffffffffffffb8);
    Vector<int,_std::allocator<int>_>::operator[]
              ((Vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (size_type)in_stack_ffffffffffffffb8);
    std::vector<amrex::Any,_std::allocator<amrex::Any>_>::resize
              ((vector<amrex::Any,_std::allocator<amrex::Any>_> *)
               CONCAT44(iVar2,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
    in_stack_ffffffffffffffc4 = 0;
    while( true ) {
      in_stack_ffffffffffffffe0 = in_stack_ffffffffffffffc4;
      piVar1 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          (size_type)in_stack_ffffffffffffffb8);
      if (*piVar1 <= in_stack_ffffffffffffffc4) break;
      (**(code **)(*in_RDI + 0x138))
                (&stack0xffffffffffffffd8,in_RDI,iVar2,in_stack_ffffffffffffffe0,in_RDX);
      Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (size_type)in_stack_ffffffffffffffb8);
      Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)
                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 (size_type)in_stack_ffffffffffffffb8);
      Any::operator=((Any *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffb8);
      Any::~Any((Any *)0x150bbf9);
      in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffe0 + 1;
    }
  }
  return;
}

Assistant:

void
MLLinOp::make (Vector<Vector<Any> >& mf, IntVect const& ng) const
{
    mf.clear();
    mf.resize(m_num_amr_levels);
    for (int alev = 0; alev < m_num_amr_levels; ++alev)
    {
        mf[alev].resize(m_num_mg_levels[alev]);
        for (int mlev = 0; mlev < m_num_mg_levels[alev]; ++mlev)
        {
            mf[alev][mlev] = AnyMake(alev, mlev, ng);
        }
    }
}